

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

int __thiscall
Catch::Generators::anon_unknown_3::GeneratorTracker::close(GeneratorTracker *this,int __fd)

{
  ITracker *pIVar1;
  pointer puVar2;
  int iVar3;
  uint uVar4;
  __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  _Var5;
  GeneratorUntypedBase *pGVar6;
  GeneratorUntypedBase *pGVar7;
  long lVar8;
  ulong uVar9;
  unique_ptr<Catch::TestCaseTracking::ITracker> *child;
  pointer puVar10;
  pointer puVar11;
  GeneratorTracker *pGVar12;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  TestCaseTracking::TrackerBase::close(&this->super_TrackerBase,__fd);
  pGVar7 = (GeneratorUntypedBase *)
           (this->super_TrackerBase).super_ITracker.m_children.
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var5._M_current =
       (StringRef *)
       (this->super_TrackerBase).super_ITracker.m_children.
       super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (pGVar7 != (GeneratorUntypedBase *)_Var5._M_current) {
    uVar9 = (long)_Var5._M_current - (long)pGVar7;
    pGVar12 = this;
    if (0 < (long)uVar9 >> 5) {
      pGVar6 = (GeneratorUntypedBase *)
               ((long)&pGVar7->_vptr_GeneratorUntypedBase + (uVar9 & 0xffffffffffffffe0));
      lVar8 = ((long)uVar9 >> 5) + 1;
      pGVar7 = (GeneratorUntypedBase *)&(pGVar7->m_stringReprCache)._M_string_length;
      do {
        if (*(int *)(*(long *)((long)&pGVar7[-1].m_stringReprCache.field_2 + 8) + 0x58) != 0) {
          pGVar7 = (GeneratorUntypedBase *)((long)&pGVar7[-1].m_stringReprCache.field_2 + 8);
          goto LAB_001627c6;
        }
        if (*(int *)(pGVar7[-1].m_currentElementIndex + 0x58) != 0) {
          pGVar7 = (GeneratorUntypedBase *)&pGVar7[-1].m_currentElementIndex;
          goto LAB_001627c6;
        }
        if (*(int *)(pGVar7->_vptr_GeneratorUntypedBase + 0xb) != 0) goto LAB_001627c6;
        if (*(int *)((pGVar7->m_stringReprCache)._M_dataplus._M_p + 0x58) != 0) {
          pGVar7 = (GeneratorUntypedBase *)&pGVar7->m_stringReprCache;
          goto LAB_001627c6;
        }
        lVar8 = lVar8 + -1;
        pGVar7 = (GeneratorUntypedBase *)((pGVar7->m_stringReprCache).field_2._M_local_buf + 8);
      } while (1 < lVar8);
      uVar9 = (long)_Var5._M_current - (long)pGVar6;
      pGVar7 = pGVar6;
    }
    lVar8 = (long)uVar9 >> 3;
    if (lVar8 == 1) {
LAB_001627a6:
      if (*(int *)(pGVar7->_vptr_GeneratorUntypedBase + 0xb) == 0) {
        pGVar7 = (GeneratorUntypedBase *)_Var5._M_current;
      }
LAB_001627c6:
      if (pGVar7 != (GeneratorUntypedBase *)_Var5._M_current) goto LAB_001627cb;
    }
    else {
      if (lVar8 == 2) {
LAB_00162799:
        if (*(int *)(pGVar7->_vptr_GeneratorUntypedBase + 0xb) == 0) {
          pGVar7 = (GeneratorUntypedBase *)&pGVar7->m_stringReprCache;
          goto LAB_001627a6;
        }
        goto LAB_001627c6;
      }
      if (lVar8 == 3) {
        if (*(int *)(pGVar7->_vptr_GeneratorUntypedBase + 0xb) == 0) {
          pGVar7 = (GeneratorUntypedBase *)&pGVar7->m_stringReprCache;
          goto LAB_00162799;
        }
        goto LAB_001627c6;
      }
    }
    do {
      pGVar12 = (GeneratorTracker *)(pGVar12->super_TrackerBase).super_ITracker.m_parent;
      iVar3 = (*(pGVar12->super_TrackerBase).super_ITracker._vptr_ITracker[5])(pGVar12);
    } while ((char)iVar3 == '\0');
    _Var5._M_current = (StringRef *)(pGVar12->super_IGeneratorTracker)._vptr_IGeneratorTracker;
    if ((GeneratorUntypedBase *)_Var5._M_current == (pGVar12->m_generator).m_ptr) goto LAB_0016286d;
    puVar2 = (this->super_TrackerBase).super_ITracker.m_children.
             super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = (this->super_TrackerBase).super_ITracker.m_children.
                   super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar2;
        puVar10 = puVar10 + 1) {
      uVar4 = (*puVar10->m_ptr->_vptr_ITracker[5])();
      _Var5._M_current = (StringRef *)(ulong)uVar4;
      if ((char)uVar4 != '\0') {
        pIVar1 = puVar10->m_ptr;
        local_38 = *(undefined4 *)((long)&pIVar1[1].m_nameAndLocation.name.field_2 + 8);
        uStack_34 = *(undefined4 *)((long)&pIVar1[1].m_nameAndLocation.name.field_2 + 0xc);
        uStack_30 = *(undefined4 *)&pIVar1[1].m_nameAndLocation.location.file;
        uStack_2c = *(undefined4 *)((long)&pIVar1[1].m_nameAndLocation.location.file + 4);
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<Catch::StringRef_const*,std::vector<Catch::StringRef,std::allocator<Catch::StringRef>>>,__gnu_cxx::__ops::_Iter_equals_val<Catch::StringRef_const>>
                          ((pGVar12->super_IGeneratorTracker)._vptr_IGeneratorTracker,
                           (pGVar12->m_generator).m_ptr,&local_38);
        if ((GeneratorUntypedBase *)_Var5._M_current != (pGVar12->m_generator).m_ptr)
        goto LAB_0016286d;
      }
    }
  }
LAB_001627cb:
  if ((this->super_TrackerBase).super_ITracker.m_runState != CompletedSuccessfully) {
    return (int)_Var5._M_current;
  }
  pGVar7 = (this->m_generator).m_ptr;
  iVar3 = (**pGVar7->_vptr_GeneratorUntypedBase)(pGVar7);
  if ((char)iVar3 == '\0') {
    return iVar3;
  }
  (pGVar7->m_stringReprCache)._M_string_length = 0;
  _Var5._M_current = (StringRef *)(pGVar7->m_stringReprCache)._M_dataplus._M_p;
  *(undefined1 *)&((GeneratorUntypedBase *)_Var5._M_current)->_vptr_GeneratorUntypedBase = 0;
  pGVar7->m_currentElementIndex = pGVar7->m_currentElementIndex + 1;
LAB_0016286d:
  iVar3 = (int)_Var5._M_current;
  puVar10 = (this->super_TrackerBase).super_ITracker.m_children.
            super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->super_TrackerBase).super_ITracker.m_children.
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar11 = puVar10;
  if (puVar2 != puVar10) {
    do {
      if (puVar11->m_ptr != (ITracker *)0x0) {
        uVar4 = (*puVar11->m_ptr->_vptr_ITracker[1])();
        _Var5._M_current = (StringRef *)(ulong)uVar4;
      }
      iVar3 = (int)_Var5._M_current;
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar2);
    (this->super_TrackerBase).super_ITracker.m_children.
    super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar10;
  }
  (this->super_TrackerBase).super_ITracker.m_runState = Executing;
  return iVar3;
}

Assistant:

void close() override {
                    TrackerBase::close();
                    // If a generator has a child (it is followed by a section)
                    // and none of its children have started, then we must wait
                    // until later to start consuming its values.
                    // This catches cases where `GENERATE` is placed between two
                    // `SECTION`s.
                    // **The check for m_children.empty cannot be removed**.
                    // doing so would break `GENERATE` _not_ followed by
                    // `SECTION`s.
                    const bool should_wait_for_child = [&]() {
                        // No children -> nobody to wait for
                        if ( m_children.empty() ) { return false; }
                        // If at least one child started executing, don't wait
                        if ( std::find_if(
                                 m_children.begin(),
                                 m_children.end(),
                                 []( TestCaseTracking::ITrackerPtr const&
                                         tracker ) {
                                     return tracker->hasStarted();
                                 } ) != m_children.end() ) {
                            return false;
                        }

                        // No children have started. We need to check if they
                        // _can_ start, and thus we should wait for them, or
                        // they cannot start (due to filters), and we shouldn't
                        // wait for them
                        ITracker* parent = m_parent;
                        // This is safe: there is always at least one section
                        // tracker in a test case tracking tree
                        while ( !parent->isSectionTracker() ) {
                            parent = parent->parent();
                        }
                        assert( parent &&
                                "Missing root (test case) level section" );

                        auto const& parentSection =
                            static_cast<SectionTracker const&>( *parent );
                        auto const& filters = parentSection.getFilters();
                        // No filters -> no restrictions on running sections
                        if ( filters.empty() ) { return true; }

                        for ( auto const& child : m_children ) {
                            if ( child->isSectionTracker() &&
                                 std::find( filters.begin(),
                                            filters.end(),
                                            static_cast<SectionTracker const&>(
                                                *child )
                                                .trimmedName() ) !=
                                     filters.end() ) {
                                return true;
                            }
                        }
                        return false;
                    }();

                    // This check is a bit tricky, because m_generator->next()
                    // has a side-effect, where it consumes generator's current
                    // value, but we do not want to invoke the side-effect if
                    // this generator is still waiting for any child to start.
                    assert( m_generator && "Tracker without generator" );
                    if ( should_wait_for_child ||
                         ( m_runState == CompletedSuccessfully &&
                           m_generator->countedNext() ) ) {
                        m_children.clear();
                        m_runState = Executing;
                    }
                }